

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImGui::GetKeyPressedAmount(int key_index,float repeat_delay,float repeat_rate)

{
  float t1;
  int iVar1;
  
  if (-1 < key_index) {
    t1 = (GImGui->IO).KeysDownDuration[(uint)key_index];
    iVar1 = CalcTypematicRepeatAmount(t1 - (GImGui->IO).DeltaTime,t1,repeat_delay,repeat_rate);
    return iVar1;
  }
  return 0;
}

Assistant:

int ImGui::GetKeyPressedAmount(int key_index, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    if (key_index < 0)
        return 0;
    IM_ASSERT(key_index >= 0 && key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[key_index];
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}